

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_set_socket_functions.c
# Opt level: O0

int default_aclose(ares_socket_t sock,void *user_data)

{
  int iVar1;
  void *user_data_local;
  ares_socket_t sock_local;
  
  iVar1 = close(sock);
  return iVar1;
}

Assistant:

static int default_aclose(ares_socket_t sock, void *user_data)
{
  (void)user_data;

#if defined(HAVE_CLOSESOCKET)
  return closesocket(sock);
#elif defined(HAVE_CLOSESOCKET_CAMEL)
  return CloseSocket(sock);
#elif defined(HAVE_CLOSE_S)
  return close_s(sock);
#else
  return close(sock);
#endif
}